

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O2

Path * __thiscall tinyusdz::Path::get_parent_prim_path(Path *__return_storage_ptr__,Path *this)

{
  bool bVar1;
  long lVar2;
  allocator local_5a;
  allocator local_59;
  string local_58;
  string local_38;
  
  if (this->_valid == false) {
LAB_00212ad9:
    Path(__return_storage_ptr__);
  }
  else {
    bVar1 = is_root_prim(this);
    if (bVar1) {
      Path(__return_storage_ptr__,this);
      return __return_storage_ptr__;
    }
    if (((this->_prim_part)._M_string_length == 0) || ((this->_prop_part)._M_string_length == 0)) {
      lVar2 = ::std::__cxx11::string::rfind((char)this,0x2f);
      if (lVar2 == 0) {
        ::std::__cxx11::string::string((string *)&local_38,"/",&local_5a);
        ::std::__cxx11::string::string((string *)&local_58,"",&local_59);
        Path(__return_storage_ptr__,&local_38,&local_58);
        ::std::__cxx11::string::_M_dispose();
      }
      else {
        if (lVar2 == -1) goto LAB_00212ad9;
        ::std::__cxx11::string::substr((ulong)&local_38,(ulong)this);
        ::std::__cxx11::string::string((string *)&local_58,"",&local_5a);
        Path(__return_storage_ptr__,&local_38,&local_58);
        ::std::__cxx11::string::_M_dispose();
      }
    }
    else {
      ::std::__cxx11::string::string((string *)&local_38,"",(allocator *)&local_58);
      Path(__return_storage_ptr__,&this->_prim_part,&local_38);
    }
    ::std::__cxx11::string::_M_dispose();
  }
  return __return_storage_ptr__;
}

Assistant:

Path Path::get_parent_prim_path() const {
  if (!_valid) {
    return Path();
  }

  if (is_root_prim()) {
    return *this;
  }

  if (is_prim_property_path()) {
    // return prim part
    return Path(prim_part(), "");
  }

  size_t n = _prim_part.find_last_of('/');
  if (n == std::string::npos) {
    // this should never happen though.
    return Path();
  }

  if (n == 0) {
    // return root
    return Path("/", "");
  }

  return Path(_prim_part.substr(0, n), "");
}